

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_executor.hpp
# Opt level: O2

void duckdb::UnaryExecutor::
     ExecuteFlat<duckdb::string_t,duckdb::hugeint_t,duckdb::UnaryLambdaWrapper,duckdb::hugeint_t(*)(duckdb::string_t_const&)>
               (string_t *ldata,hugeint_t *result_data,idx_t count,ValidityMask *mask,
               ValidityMask *result_mask,void *dataptr,bool adds_nulls)

{
  undefined4 *puVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  _func_hugeint_t_string_t_ptr **fun;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  bool bVar11;
  undefined1 auVar12 [16];
  idx_t local_60;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  ulong local_38;
  
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    lVar5 = 8;
    local_60 = count;
    while (bVar11 = local_60 != 0, local_60 = local_60 - 1, bVar11) {
      puVar1 = (undefined4 *)((long)ldata + lVar5 + -8);
      local_48 = *puVar1;
      uStack_44 = puVar1[1];
      uStack_40 = puVar1[2];
      uStack_3c = puVar1[3];
      auVar12 = (**dataptr)(&local_48);
      *(long *)((long)result_data + lVar5 + -8) = auVar12._0_8_;
      *(long *)((long)&result_data->lower + lVar5) = auVar12._8_8_;
      lVar5 = lVar5 + 0x10;
    }
  }
  else {
    if (adds_nulls) {
      TemplatedValidityMask<unsigned_long>::Copy
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>,count);
    }
    else {
      TemplatedValidityMask<unsigned_long>::Initialize
                (&result_mask->super_TemplatedValidityMask<unsigned_long>,
                 &mask->super_TemplatedValidityMask<unsigned_long>);
    }
    local_38 = count + 0x3f >> 6;
    uVar9 = 0;
    for (uVar4 = 0; uVar4 != local_38; uVar4 = uVar4 + 1) {
      puVar2 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
LAB_0077e54b:
        uVar6 = uVar9 << 4 | 8;
        for (; uVar3 = uVar9, uVar9 < uVar10; uVar9 = uVar9 + 1) {
          puVar1 = (undefined4 *)((long)ldata + (uVar6 - 8));
          local_48 = *puVar1;
          uStack_44 = puVar1[1];
          uStack_40 = puVar1[2];
          uStack_3c = puVar1[3];
          auVar12 = (**dataptr)(&local_48);
          *(long *)((long)result_data + (uVar6 - 8)) = auVar12._0_8_;
          *(long *)((long)&result_data->lower + uVar6) = auVar12._8_8_;
          uVar6 = uVar6 + 0x10;
        }
      }
      else {
        uVar6 = puVar2[uVar4];
        uVar10 = uVar9 + 0x40;
        if (count <= uVar9 + 0x40) {
          uVar10 = count;
        }
        if (uVar6 == 0xffffffffffffffff) goto LAB_0077e54b;
        uVar3 = uVar10;
        if (uVar6 != 0) {
          uVar8 = uVar9 << 4 | 8;
          for (uVar7 = 0; uVar3 = uVar7 + uVar9, uVar7 + uVar9 < uVar10; uVar7 = uVar7 + 1) {
            if ((uVar6 >> (uVar7 & 0x3f) & 1) != 0) {
              puVar1 = (undefined4 *)((long)ldata + (uVar8 - 8));
              local_48 = *puVar1;
              uStack_44 = puVar1[1];
              uStack_40 = puVar1[2];
              uStack_3c = puVar1[3];
              auVar12 = (**dataptr)(&local_48);
              *(long *)((long)result_data + (uVar8 - 8)) = auVar12._0_8_;
              *(long *)((long)&result_data->lower + uVar8) = auVar12._8_8_;
            }
            uVar8 = uVar8 + 0x10;
          }
        }
      }
      uVar9 = uVar3;
    }
  }
  return;
}

Assistant:

static inline void ExecuteFlat(const INPUT_TYPE *__restrict ldata, RESULT_TYPE *__restrict result_data, idx_t count,
	                               ValidityMask &mask, ValidityMask &result_mask, void *dataptr, bool adds_nulls) {
		ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);

		if (!mask.AllValid()) {
			if (!adds_nulls) {
				result_mask.Initialize(mask);
			} else {
				result_mask.Copy(mask, count);
			}
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
						    ldata[base_idx], result_mask, base_idx, dataptr);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							D_ASSERT(mask.RowIsValid(base_idx));
							result_data[base_idx] = OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(
							    ldata[base_idx], result_mask, base_idx, dataptr);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				result_data[i] =
				    OPWRAPPER::template Operation<OP, INPUT_TYPE, RESULT_TYPE>(ldata[i], result_mask, i, dataptr);
			}
		}
	}